

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O2

void buminiz::tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  int *piVar1;
  mz_uint16 mVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  mz_uint16 *pmVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  tdefl_sym_freq *ptVar16;
  mz_uint mVar17;
  int iVar18;
  int iVar19;
  tdefl_sym_freq *ptVar20;
  long lVar21;
  long lVar22;
  ushort uVar23;
  uint uVar24;
  uint uVar25;
  tdefl_sym_freq *ptVar26;
  ushort uVar27;
  int iVar28;
  mz_uint *__s;
  int num_codes [33];
  mz_uint next_code [33];
  int local_1138 [256];
  tdefl_sym_freq syms0 [288];
  uint auStack_8b8 [256];
  tdefl_sym_freq syms1 [288];
  
  uVar14 = 0;
  memset(num_codes,0,0x84);
  if (static_table == 0) {
    uVar7 = 0;
    if (0 < table_len) {
      uVar7 = (ulong)(uint)table_len;
    }
    uVar11 = 0;
    while( true ) {
      iVar13 = (int)uVar14;
      if (uVar7 == uVar11) break;
      mVar2 = d->m_huff_count[(uint)table_num][uVar11];
      if (mVar2 != 0) {
        syms0[iVar13].m_key = mVar2;
        uVar14 = (ulong)(iVar13 + 1);
        syms0[iVar13].m_sym_index = (mz_uint16)uVar11;
      }
      uVar11 = uVar11 + 1;
    }
    __s = next_code;
    memset(__s,0,0x800);
    for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
      uVar27 = syms0[uVar7].m_key;
      next_code[(byte)uVar27] = next_code[(byte)uVar27] + 1;
      piVar1 = (int *)((long)local_1138 + (ulong)(uVar27 >> 6 & 0xfffffffc));
      *piVar1 = *piVar1 + 1;
    }
    lVar8 = 2;
    bVar5 = local_1138[0] == iVar13;
    do {
      bVar3 = bVar5;
      lVar22 = lVar8;
      bVar9 = 0;
      lVar8 = 1;
      bVar5 = false;
    } while (bVar3);
    ptVar26 = syms1;
    ptVar20 = syms0;
    for (lVar8 = 0; ptVar16 = ptVar26, lVar8 != lVar22; lVar8 = lVar8 + 1) {
      uVar15 = 0;
      for (lVar21 = 0; lVar21 != 0x100; lVar21 = lVar21 + 1) {
        auStack_8b8[lVar21] = uVar15;
        uVar15 = uVar15 + __s[lVar21];
      }
      for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
        uVar24 = ptVar20[uVar7].m_key >> (bVar9 & 0x1f) & 0xff;
        uVar15 = auStack_8b8[uVar24];
        auStack_8b8[uVar24] = uVar15 + 1;
        ptVar16[uVar15] = ptVar20[uVar7];
      }
      bVar9 = bVar9 + 8;
      __s = __s + 0x100;
      ptVar26 = ptVar20;
      ptVar20 = ptVar16;
    }
    if (iVar13 != 0) {
      if (iVar13 == 1) {
        ptVar20->m_key = 1;
      }
      else {
        ptVar20->m_key = ptVar20->m_key + ptVar20[1].m_key;
        iVar6 = iVar13 + -1;
        iVar10 = 2;
        iVar18 = 0;
        for (lVar8 = 1; lVar8 < iVar6; lVar8 = lVar8 + 1) {
          lVar22 = (long)iVar18;
          if ((iVar10 < iVar13) &&
             (lVar21 = (long)iVar10, ptVar20[lVar21].m_key <= ptVar20[lVar22].m_key)) {
            iVar10 = iVar10 + 1;
            ptVar20[lVar8].m_key = ptVar20[lVar21].m_key;
          }
          else {
            ptVar20[lVar8].m_key = ptVar20[lVar22].m_key;
            iVar18 = iVar18 + 1;
            ptVar20[lVar22].m_key = (mz_uint16)lVar8;
            lVar22 = (long)iVar18;
          }
          if (iVar10 < iVar13) {
            if (lVar22 < lVar8) {
              uVar27 = ptVar20[lVar22].m_key;
              uVar23 = ptVar20[iVar10].m_key;
              if (uVar27 < uVar23) goto LAB_00219257;
            }
            else {
              uVar23 = ptVar20[iVar10].m_key;
            }
            iVar10 = iVar10 + 1;
            ptVar20[lVar8].m_key = ptVar20[lVar8].m_key + uVar23;
          }
          else {
            uVar27 = ptVar20[lVar22].m_key;
LAB_00219257:
            ptVar20[lVar8].m_key = ptVar20[lVar8].m_key + uVar27;
            iVar18 = iVar18 + 1;
            ptVar20[lVar22].m_key = (mz_uint16)lVar8;
          }
        }
        uVar15 = iVar13 - 2;
        ptVar20[(long)iVar13 + -2].m_key = 0;
        for (uVar24 = iVar13 - 3; -1 < (int)uVar24; uVar24 = uVar24 - 1) {
          ptVar20[uVar24].m_key = ptVar20[ptVar20[uVar24].m_key].m_key + 1;
        }
        uVar24 = 0;
        iVar10 = 1;
        while (iVar10 != 0) {
          uVar25 = 0xffffffff;
          if ((int)uVar15 < -1) {
            uVar25 = uVar15;
          }
          iVar18 = uVar15 - uVar25;
          iVar28 = 0;
          while ((uVar4 = uVar25, iVar19 = iVar18, iVar28 != iVar18 &&
                 (uVar4 = uVar15, iVar19 = iVar28, uVar24 == ptVar20[uVar15].m_key))) {
            iVar28 = iVar28 + 1;
            uVar15 = uVar15 - 1;
          }
          uVar15 = uVar4;
          ptVar26 = ptVar20 + iVar6;
          for (; iVar19 < iVar10; iVar10 = iVar10 + -1) {
            ptVar26->m_key = (mz_uint16)uVar24;
            iVar6 = iVar6 + -1;
            ptVar26 = ptVar26 + -1;
          }
          uVar24 = uVar24 + 1;
          iVar10 = iVar19 * 2;
        }
      }
    }
    uVar11 = 0;
    uVar7 = 0;
    if (0 < iVar13) {
      uVar7 = uVar14;
    }
    for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
      num_codes[ptVar20[uVar11].m_key] = num_codes[ptVar20[uVar11].m_key] + 1;
    }
    if (1 < iVar13) {
      uVar7 = (ulong)(uint)code_size_limit;
      for (lVar8 = (long)code_size_limit; lVar8 < 0x20; lVar8 = lVar8 + 1) {
        num_codes[uVar7] = num_codes[uVar7] + num_codes[lVar8 + 1];
      }
      bVar9 = 0;
      uVar15 = 0;
      for (uVar11 = uVar7; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        uVar15 = uVar15 + (num_codes[uVar11] << (bVar9 & 0x1f));
        bVar9 = bVar9 + 1;
      }
      for (; 1L << ((byte)code_size_limit & 0x3f) != (ulong)uVar15; uVar15 = uVar15 - 1) {
        num_codes[uVar7] = num_codes[uVar7] + -1;
        uVar11 = uVar7;
        do {
          if ((int)uVar11 < 2) goto LAB_002191de;
          lVar8 = uVar11 - 1;
          uVar11 = uVar11 - 1;
        } while (num_codes[lVar8] == 0);
        num_codes[uVar11] = num_codes[lVar8] + -1;
        num_codes[(int)uVar11 + 1U & 0x7fffffff] = num_codes[(int)uVar11 + 1U & 0x7fffffff] + 2;
LAB_002191de:
      }
    }
    memset(d->m_huff_code_sizes + (uint)table_num,0,0x120);
    memset(d->m_huff_codes + (uint)table_num,0,0x240);
    iVar13 = 0;
    if (0 < code_size_limit) {
      iVar13 = code_size_limit;
    }
    for (uVar7 = 1; uVar7 != iVar13 + 1; uVar7 = uVar7 + 1) {
      pmVar12 = &ptVar20[(long)(int)uVar14 + -1].m_sym_index;
      for (iVar10 = num_codes[uVar7]; 0 < iVar10; iVar10 = iVar10 + -1) {
        d->m_huff_code_sizes[(uint)table_num][*pmVar12] = (mz_uint8)uVar7;
        uVar14 = (ulong)((int)uVar14 - 1);
        pmVar12 = pmVar12 + -2;
      }
    }
  }
  else {
    uVar7 = 0;
    if (0 < table_len) {
      uVar7 = (ulong)(uint)table_len;
    }
    for (; uVar7 != uVar14; uVar14 = uVar14 + 1) {
      num_codes[d->m_huff_code_sizes[(uint)table_num][uVar14]] =
           num_codes[d->m_huff_code_sizes[(uint)table_num][uVar14]] + 1;
    }
  }
  next_code[1] = 0;
  mVar17 = 0;
  for (lVar8 = 2; lVar8 <= code_size_limit; lVar8 = lVar8 + 1) {
    mVar17 = (mVar17 + num_codes[lVar8 + -1]) * 2;
    next_code[lVar8] = mVar17;
  }
  uVar7 = 0;
  uVar14 = (ulong)(uint)table_len;
  if (table_len < 1) {
    uVar14 = uVar7;
  }
  for (; uVar7 != uVar14; uVar7 = uVar7 + 1) {
    bVar9 = d->m_huff_code_sizes[(uint)table_num][uVar7];
    uVar15 = (uint)bVar9;
    if (bVar9 != 0) {
      mVar17 = next_code[bVar9];
      next_code[bVar9] = mVar17 + 1;
      iVar13 = 0;
      for (; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
        iVar13 = (mVar17 & 1) + iVar13 * 2;
        mVar17 = mVar17 >> 1;
      }
      d->m_huff_codes[(uint)table_num][uVar7] = (mz_uint16)iVar13;
    }
  }
  return;
}

Assistant:

static void tdefl_optimize_huffman_table(tdefl_compressor *d, int table_num, int table_len, int code_size_limit, int static_table)
{
  int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE]; mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1]; MZ_CLEAR_OBJ(num_codes);
  if (static_table)
  {
    for (i = 0; i < table_len; i++) num_codes[d->m_huff_code_sizes[table_num][i]]++;
  }
  else
  {
    tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS], *pSyms;
    int num_used_syms = 0;
    const mz_uint16 *pSym_count = &d->m_huff_count[table_num][0];
    for (i = 0; i < table_len; i++) if (pSym_count[i]) { syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i]; syms0[num_used_syms++].m_sym_index = (mz_uint16)i; }

    pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1); tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

    for (i = 0; i < num_used_syms; i++) num_codes[pSyms[i].m_key]++;

    tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms, code_size_limit);

    MZ_CLEAR_OBJ(d->m_huff_code_sizes[table_num]); MZ_CLEAR_OBJ(d->m_huff_codes[table_num]);
    for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
      for (l = num_codes[i]; l > 0; l--) d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
  }

  next_code[1] = 0; for (j = 0, i = 2; i <= code_size_limit; i++) next_code[i] = j = ((j + num_codes[i - 1]) << 1);

  for (i = 0; i < table_len; i++)
  {
    mz_uint rev_code = 0, code, code_size; if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0) continue;
    code = next_code[code_size]++; for (l = code_size; l > 0; l--, code >>= 1) rev_code = (rev_code << 1) | (code & 1);
    d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
  }
}